

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O1

void __thiscall cmComputeLinkDepends::LinkEntry::LinkEntry(LinkEntry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint7 uStack_37;
  undefined8 uStack_30;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_28;
  
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_28);
  paVar1 = &(this->Item).Value.field_2;
  (this->Item).Value._M_dataplus._M_p = (pointer)paVar1;
  paVar1->_M_allocated_capacity = (ulong)uStack_37 << 8;
  *(undefined8 *)((long)&(this->Item).Value.field_2 + 8) = uStack_30;
  (this->Item).Value._M_string_length = 0;
  (this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_28.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_28.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  this->Target = (cmGeneratorTarget *)0x0;
  this->ObjectSource = (cmSourceFile *)0x0;
  this->Kind = Library;
  (this->Feature)._M_dataplus._M_p = (pointer)&(this->Feature).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Feature,cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p,
             cmLinkItem::DEFAULT_abi_cxx11_._M_dataplus._M_p +
             cmLinkItem::DEFAULT_abi_cxx11_._M_string_length);
  return;
}

Assistant:

LinkEntry() = default;